

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O1

void __thiscall
branch_and_reduce_algorithm::addStartingSolution
          (branch_and_reduce_algorithm *this,vector<int,_std::allocator<int>_> *solution,
          int solutionSize)

{
  pointer piVar1;
  pointer piVar2;
  long lVar3;
  long lVar4;
  
  if ((long)(solution->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(solution->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start !=
      (long)(this->y).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(this->y).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ERROR: invalid solution std::vector!",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::ostream::flush();
  }
  piVar1 = (solution->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  lVar3 = (long)(solution->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 2;
    piVar2 = (this->y).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    lVar4 = 0;
    do {
      piVar2[lVar4] = piVar1[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  this->opt = solutionSize;
  this->startingSolutionIsBest = true;
  this->numBranchesPrunedByStartingSolution = 0;
  return;
}

Assistant:

void branch_and_reduce_algorithm::addStartingSolution(std::vector<int> solution, int solutionSize)
{
    if (solution.size() != y.size())
    {
        cout << "ERROR: invalid solution std::vector!" << endl
             << flush;
    }
    for (int i = 0; i < solution.size(); ++i)
    {
        y[i] = solution[i];
    }
    opt = solutionSize;

    startingSolutionIsBest = true;
    numBranchesPrunedByStartingSolution = 0;
}